

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O0

IDWNode * __thiscall gmath::IDWNode::add(IDWNode *this,uint _x,uint _y,float _f,float _w)

{
  int iVar1;
  byte bVar2;
  IDWNode *pIVar3;
  void *pvVar4;
  uint in_EDX;
  uint in_ESI;
  IDWNode *in_RDI;
  bool bVar5;
  float in_XMM0_Da;
  float fVar6;
  float in_XMM1_Da;
  IDWNode *in_stack_00000008;
  uint in_stack_00000014;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  IDWNode *in_stack_00000020;
  uint k;
  int i_1;
  float scale;
  int cn;
  int i;
  IDWNode *ret;
  uint local_44;
  int local_24;
  IDWNode *pIVar7;
  
  if ((((in_ESI < in_RDI->x) || (in_RDI->x + in_RDI->s <= in_ESI)) || (in_EDX < in_RDI->y)) ||
     (in_RDI->y + in_RDI->s <= in_EDX)) {
    bVar2 = 0xff;
    for (local_44 = in_RDI->s; local_44 != 0; local_44 = local_44 >> 1) {
      bVar2 = bVar2 + 1;
    }
    do {
      bVar2 = bVar2 + 1;
      bVar5 = true;
      if ((((in_RDI->x >> (bVar2 & 0x1f)) << (bVar2 & 0x1f) <= in_ESI) &&
          (bVar5 = true, in_ESI < (in_RDI->x >> (bVar2 & 0x1f)) + 1 << (bVar2 & 0x1f))) &&
         (bVar5 = true, (in_RDI->y >> (bVar2 & 0x1f)) << (bVar2 & 0x1f) <= in_EDX)) {
        bVar5 = (in_RDI->y >> (bVar2 & 0x1f)) + 1 << (bVar2 & 0x1f) <= in_EDX;
      }
    } while (bVar5);
    pvVar4 = operator_new(0x48);
    IDWNode(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014,
            in_stack_00000008);
    in_RDI = add((IDWNode *)CONCAT44(in_ESI,in_EDX),(uint)in_XMM0_Da,(uint)in_XMM1_Da,
                 (float)((ulong)pvVar4 >> 0x20),SUB84(pvVar4,0));
  }
  else if (in_RDI->s < 2) {
    in_RDI->f = in_XMM0_Da;
    in_RDI->w = in_XMM1_Da;
  }
  else {
    if (in_ESI < in_RDI->x + (in_RDI->s >> 1)) {
      local_24 = 2;
      if (in_EDX < in_RDI->y + (in_RDI->s >> 1)) {
        local_24 = 0;
      }
    }
    else {
      local_24 = 3;
      if (in_EDX < in_RDI->y + (in_RDI->s >> 1)) {
        local_24 = 1;
      }
    }
    pIVar7 = in_RDI;
    if (in_RDI->child[local_24] == (IDWNode *)0x0) {
      pIVar3 = (IDWNode *)operator_new(0x48);
      IDWNode(pIVar3,in_ESI,in_EDX,in_XMM0_Da,in_XMM1_Da);
      in_RDI->child[local_24] = pIVar3;
    }
    else {
      pIVar3 = add((IDWNode *)CONCAT44(in_ESI,in_EDX),(uint)in_XMM0_Da,(uint)in_XMM1_Da,
                   (float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
      in_RDI->child[local_24] = pIVar3;
    }
    in_RDI->n = 0;
    in_RDI->f = 0.0;
    in_RDI->w = 0.0;
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      if (in_RDI->child[local_24] != (IDWNode *)0x0) {
        iVar1 = in_RDI->child[local_24]->n;
        in_RDI->n = iVar1 + in_RDI->n;
        in_RDI->f = (float)iVar1 * in_RDI->child[local_24]->f + in_RDI->f;
        in_RDI->w = (float)iVar1 * in_RDI->child[local_24]->w + in_RDI->w;
      }
    }
    fVar6 = 1.0 / (float)in_RDI->n;
    in_RDI->f = fVar6 * in_RDI->f;
    in_RDI->w = fVar6 * in_RDI->w;
    in_RDI = pIVar7;
  }
  return in_RDI;
}

Assistant:

IDWNode *IDWNode::add(unsigned int _x, unsigned int _y, float _f, float _w)
{
  IDWNode *ret=this;

  // is value covered by this node?

  if (_x >= x && _x < x+s && _y >= y && _y < y+s)
  {
    if (s > 1)
    {
      // check into which child node the data point falls

      int i;
      if (_x < x+(s>>1))
      {
        i=2;
        if (_y < y+(s>>1))
        {
          i=0;
        }
      }
      else
      {
        i=3;
        if (_y < y+(s>>1))
        {
          i=1;
        }
      }

      // add to child node

      if (child[i] != 0)
      {
        child[i]=child[i]->add(_x, _y, _f, _w);
      }
      else
      {
        child[i]=new IDWNode(_x, _y, _f, _w);
      }

      // recalculate data of this node

      n=0;
      f=0;
      w=0;

      for (i=0; i<4; i++)
      {
        if (child[i] != 0)
        {
          const int cn=child[i]->n;

          n+=cn;
          f+=cn*child[i]->f;
          w+=cn*child[i]->w;
        }
      }

      const float scale=1.0f/n;

      f*=scale;
      w*=scale;
    }
    else
    {
      // replace data of node with given data

      f=_f;
      w=_w;
    }
  }
  else
  {
    // compute size of parent node that covers existing and new data

    int i=-1;
    unsigned int k=s;
    while (k > 0)
    {
      k>>=1;
      i++;
    }

    i++;
    while (_x < (x>>i)<<i || _x >= ((x>>i)+1)<<i || _y < (y>>i)<<i || _y >= ((y>>i)+1)<<i)
      i++;

    // create parent node

    ret=new IDWNode((x>>i)<<i, (y>>i)<<i, 1<<i, this);

    // add new data value

    ret=ret->add(_x, _y, _f, _w);
  }

  return ret;
}